

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_anyNotEqual_vec2(ShaderEvalContext *c)

{
  ulong uVar1;
  bool bVar2;
  int i;
  long lVar3;
  bool bVar4;
  float local_10 [2];
  ulong local_8;
  
  local_10[0] = c->in[0].m_data[3];
  local_10[1] = c->in[0].m_data[1];
  uVar1 = *(ulong *)c->in[1].m_data;
  local_8 = uVar1 << 0x20 | uVar1 >> 0x20;
  lVar3 = 0;
  bVar4 = false;
  do {
    bVar2 = !bVar4;
    bVar4 = true;
    if (bVar2) {
      bVar4 = *(float *)((long)&local_8 + lVar3 * 4) != local_10[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  (c->color).m_data[0] = (float)bVar4;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }